

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortRangeInteraction.cpp
# Opt level: O0

void __thiscall OpenMD::ShortRangeInteraction::ShortRangeInteraction(ShortRangeInteraction *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__ShortRangeInteraction_005086f8;
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)0x2876ca);
  *(undefined4 *)(in_RDI + 5) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x2c) = 0xffffffff;
  PropertyMap::PropertyMap((PropertyMap *)0x2876e6);
  return;
}

Assistant:

ShortRangeInteraction::ShortRangeInteraction() :
      globalIndex_(-1), localIndex_(-1) {}